

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

void __thiscall fasttext::Model::computeOutputSoftmax(Model *this,Vector *hidden,Vector *output)

{
  element_type *peVar1;
  real *prVar2;
  float *pfVar3;
  long in_RDI;
  double dVar4;
  int32_t i_2;
  int32_t i_1;
  int32_t i;
  real z;
  real max;
  int64_t in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  float in_stack_ffffffffffffffb4;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int iVar5;
  undefined4 in_stack_ffffffffffffffe0;
  float fVar6;
  float fVar7;
  float in_stack_ffffffffffffffe4;
  real rVar8;
  
  if ((*(byte *)(in_RDI + 0x150) & 1) != 0) {
    peVar1 = std::__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<fasttext::Args,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x16cc04);
    if ((peVar1->qout & 1U) != 0) {
      std::__shared_ptr_access<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator*((__shared_ptr_access<fasttext::QMatrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
      Vector::mul((Vector *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                  (QMatrix *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
                  (Vector *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      goto LAB_0016cc63;
    }
  }
  std::__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator*
            ((__shared_ptr_access<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0));
  Vector::mul((Vector *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
              (Matrix *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8),
              (Vector *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
LAB_0016cc63:
  prVar2 = Vector::operator[]((Vector *)
                              CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                              in_stack_ffffffffffffffa8);
  rVar8 = *prVar2;
  fVar6 = 0.0;
  for (iVar5 = 0; iVar5 < *(int *)(in_RDI + 0x9c); iVar5 = iVar5 + 1) {
    prVar2 = Vector::operator[]((Vector *)
                                CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                                in_stack_ffffffffffffffa8);
    pfVar3 = std::max<float>(prVar2,(float *)&stack0xffffffffffffffe4);
    rVar8 = *pfVar3;
  }
  for (iVar5 = 0; iVar5 < *(int *)(in_RDI + 0x9c); iVar5 = iVar5 + 1) {
    prVar2 = Vector::operator[]((Vector *)
                                CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                                in_stack_ffffffffffffffa8);
    dVar4 = exp((double)(*prVar2 - rVar8));
    in_stack_ffffffffffffffb4 = (float)dVar4;
    prVar2 = Vector::operator[]((Vector *)
                                CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                                in_stack_ffffffffffffffa8);
    *prVar2 = in_stack_ffffffffffffffb4;
    prVar2 = Vector::operator[]((Vector *)
                                CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                                in_stack_ffffffffffffffa8);
    fVar6 = *prVar2 + fVar6;
  }
  for (iVar5 = 0; iVar5 < *(int *)(in_RDI + 0x9c); iVar5 = iVar5 + 1) {
    fVar7 = fVar6;
    prVar2 = Vector::operator[]((Vector *)CONCAT44(in_stack_ffffffffffffffb4,fVar6),
                                in_stack_ffffffffffffffa8);
    *prVar2 = *prVar2 / fVar6;
    fVar6 = fVar7;
  }
  return;
}

Assistant:

void Model::computeOutputSoftmax(Vector& hidden, Vector& output) const {
  if (quant_ && args_->qout) {
    output.mul(*qwo_, hidden);
  } else {
    output.mul(*wo_, hidden);
  }
  real max = output[0], z = 0.0;
  for (int32_t i = 0; i < osz_; i++) {
    max = std::max(output[i], max);
  }
  for (int32_t i = 0; i < osz_; i++) {
    output[i] = exp(output[i] - max);
    z += output[i];
  }
  for (int32_t i = 0; i < osz_; i++) {
    output[i] /= z;
  }
}